

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

double RDL_getNofRCForRCF_internal
                 (RDL_data *data,uint bcc_index,uint urf_internal_index,uint rcf_internal_index)

{
  RDL_graph *pRVar1;
  RDL_cfam **ppRVar2;
  RDL_cfam *pRVar3;
  double dVar4;
  double dVar5;
  
  pRVar1 = data->bccGraphs->bcc_graphs[bcc_index];
  ppRVar2 = data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];
  pRVar3 = ppRVar2[rcf_internal_index];
  dVar4 = RDL_countPaths(pRVar3->r,pRVar3->q,pRVar1->V,data->spiPerBCC[bcc_index]);
  pRVar3 = ppRVar2[rcf_internal_index];
  dVar5 = RDL_countPaths(pRVar3->r,pRVar3->p,pRVar1->V,data->spiPerBCC[bcc_index]);
  if ((1.3407807929942596e+154 <= dVar4) || (1.3407807929942596e+154 <= dVar5)) {
    (*RDL_outputFunc)(RDL_WARNING,"result overflow when counting paths!\n");
    dVar4 = 1.79769313486232e+308;
  }
  else {
    dVar4 = dVar4 * dVar5;
  }
  return dVar4;
}

Assistant:

static double RDL_getNofRCForRCF_internal(const RDL_data *data,
    unsigned bcc_index, unsigned urf_internal_index,
    unsigned rcf_internal_index)
{
  double nofPaths1, nofPaths2, result;
  const double prod_limit = sqrt(DBL_MAX) - 1.0;
  const RDL_cfam** URF;
  const RDL_graph* graph;

  result = 0.0;

  graph = data->bccGraphs->bcc_graphs[bcc_index];

  URF = (const RDL_cfam **)data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];

  /* count the number of paths one both sides */
  nofPaths1 = RDL_countPaths(URF[rcf_internal_index]->r, URF[rcf_internal_index]->q,
      graph->V, data->spiPerBCC[bcc_index]);
  nofPaths2 = RDL_countPaths(URF[rcf_internal_index]->r, URF[rcf_internal_index]->p,
      graph->V, data->spiPerBCC[bcc_index]);

  result = nofPaths1 * nofPaths2;

  /* check if either of the number paths is larger than what we can multiply */
  if (nofPaths1 >= prod_limit || nofPaths2 >= prod_limit) {
    RDL_outputFunc(RDL_WARNING, "result overflow when counting paths!\n");
    return RDL_INVALID_RC_COUNT;
  }

  return result;
}